

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O2

void delete_all_parts(Am_Object *interp)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object obj;
  Am_Value_List new_objs;
  Am_Object local_28;
  Am_Value_List local_20;
  
  pAVar2 = Am_Object::Get(interp,0x82,0);
  Am_Value_List::Am_Value_List(&local_20,pAVar2);
  local_28.data = (Am_Object_Data *)0x0;
  Am_Value_List::Start(&local_20);
  while( true ) {
    bVar1 = Am_Value_List::Last(&local_20);
    if (bVar1) break;
    pAVar2 = Am_Value_List::Get(&local_20);
    Am_Object::operator=(&local_28,pAVar2);
    Am_Object::Remove_From_Owner(&local_28);
    Am_Value_List::Next(&local_20);
  }
  Am_Object::~Am_Object(&local_28);
  Am_Value_List::~Am_Value_List(&local_20);
  return;
}

Assistant:

void
delete_all_parts(Am_Object &interp)
{
  Am_Value_List new_objs = interp.Get(Am_GRAPHICAL_PARTS);
  //std::cout << "DONE ALL, destroying " << new_objs <<std::endl <<std::flush;
  Am_Object obj;
  for (new_objs.Start(); !new_objs.Last(); new_objs.Next()) {
    obj = new_objs.Get();
    // obj.Destroy(); BUG
    obj.Remove_From_Owner();
  }
}